

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferFFS.cpp
# Opt level: O2

void __thiscall adios2::format::BufferFFS::~BufferFFS(BufferFFS *this)

{
  (this->super_Buffer)._vptr_Buffer = (_func_int **)&PTR__BufferFFS_00821cd0;
  free_FFSBuffer(this->m_buffer);
  Buffer::~Buffer(&this->super_Buffer);
  return;
}

Assistant:

BufferFFS::~BufferFFS() { free_FFSBuffer(m_buffer); }